

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

bool __thiscall
ON_Layer::HasPerViewportSettings(ON_Layer *this,ON_UUID viewport_id,uint settings_mask)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ON__LayerExtensions *pOVar4;
  ON__LayerPerViewSettings *pOVar5;
  undefined1 in_R9B;
  ON_UUID viewport_id_00;
  ON__LayerPerViewSettings *pvs;
  ON__LayerPerViewSettings *s;
  int i;
  int count;
  ON__LayerExtensions *ud;
  uint settings_mask_local;
  ON_Layer *this_local;
  ON_UUID viewport_id_local;
  
  viewport_id_local._0_8_ = viewport_id.Data4;
  register0x00000030 = viewport_id._0_8_;
  if (settings_mask != 0) {
    bVar1 = ON_UuidIsNil((ON_UUID *)((long)&this_local + 4));
    if (bVar1) {
      pOVar4 = ON__LayerExtensions::LayerExtensions(this,&this->m_extension_bits,false);
      if (pOVar4 != (ON__LayerExtensions *)0x0) {
        iVar2 = ON_SimpleArray<ON__LayerPerViewSettings>::Count(&pOVar4->m_vp_settings);
        for (s._0_4_ = 0; (int)s < iVar2; s._0_4_ = (int)s + 1) {
          pOVar5 = ON_SimpleArray<ON__LayerPerViewSettings>::operator[]
                             (&pOVar4->m_vp_settings,(int)s);
          uVar3 = ON__LayerPerViewSettings::SettingsMask(pOVar5);
          if ((settings_mask & uVar3) != 0) {
            return true;
          }
        }
      }
    }
    else {
      viewport_id_00.Data4[0] = '\0';
      viewport_id_00.Data4[1] = '\0';
      viewport_id_00.Data4[2] = '\0';
      viewport_id_00.Data4[3] = '\0';
      viewport_id_00.Data4[4] = '\0';
      viewport_id_00.Data4[5] = '\0';
      viewport_id_00.Data4[6] = '\0';
      viewport_id_00.Data4[7] = '\0';
      viewport_id_00.Data1 = viewport_id_local.Data1;
      viewport_id_00.Data2 = viewport_id_local.Data2;
      viewport_id_00.Data3 = viewport_id_local.Data3;
      pOVar5 = ON__LayerExtensions::ViewportSettings
                         ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,
                          stack0xffffffffffffffe4,viewport_id_00,(bool)in_R9B);
      if ((pOVar5 != (ON__LayerPerViewSettings *)0x0) &&
         (uVar3 = ON__LayerPerViewSettings::SettingsMask(pOVar5), (settings_mask & uVar3) != 0)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_Layer::HasPerViewportSettings(
    ON_UUID viewport_id,
    unsigned int settings_mask
    ) const
{

  if ( 0 != settings_mask )
  {
    if ( ON_UuidIsNil(viewport_id) )
    {
      const ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(*this,&m_extension_bits,false);
      if ( 0 != ud )
      {
        const int count = ud->m_vp_settings.Count();
        for ( int i = 0; i < count; i++ )
        {
          const ON__LayerPerViewSettings& s = ud->m_vp_settings[i];
          if ( 0 != (settings_mask & s.SettingsMask()) )
            return true;
        }
      }
    }
    else
    {
      const ON__LayerPerViewSettings* pvs = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, false );
      if ( 0 != pvs && 0 != (settings_mask & pvs->SettingsMask() ) )
        return true;
    }
  }

  return false;
}